

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

snd_pcm_format_t Pa2AlsaFormat(PaSampleFormat paFormat)

{
  PaSampleFormat paFormat_local;
  
  switch(paFormat) {
  case 1:
    paFormat_local._4_4_ = SND_PCM_FORMAT_FLOAT;
    break;
  case 2:
    paFormat_local._4_4_ = SND_PCM_FORMAT_S32;
    break;
  default:
    paFormat_local._4_4_ = SND_PCM_FORMAT_UNKNOWN;
    break;
  case 4:
    paFormat_local._4_4_ = SND_PCM_FORMAT_S24_3LE;
    break;
  case 8:
    paFormat_local._4_4_ = SND_PCM_FORMAT_S16;
    break;
  case 0x10:
    paFormat_local._4_4_ = SND_PCM_FORMAT_S8;
    break;
  case 0x20:
    paFormat_local._4_4_ = SND_PCM_FORMAT_U8;
  }
  return paFormat_local._4_4_;
}

Assistant:

static snd_pcm_format_t Pa2AlsaFormat( PaSampleFormat paFormat )
{
    switch( paFormat )
    {
        case paFloat32:
            return SND_PCM_FORMAT_FLOAT;

        case paInt16:
            return SND_PCM_FORMAT_S16;

        case paInt24:
#ifdef PA_LITTLE_ENDIAN
            return SND_PCM_FORMAT_S24_3LE;
#elif defined PA_BIG_ENDIAN
            return SND_PCM_FORMAT_S24_3BE;
#endif

        case paInt32:
            return SND_PCM_FORMAT_S32;

        case paInt8:
            return SND_PCM_FORMAT_S8;

        case paUInt8:
            return SND_PCM_FORMAT_U8;

        default:
            return SND_PCM_FORMAT_UNKNOWN;
    }
}